

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O1

void __thiscall nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages(InternalMsg *this)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  
  uVar5 = this->pageCnt;
  uVar2 = 0;
  uVar3 = uVar2;
  if (uVar5 != 0) {
    do {
      free((this->firstHeader).firstPages[uVar3].ptr);
      uVar2 = uVar3 + 1;
      uVar5 = this->pageCnt;
      if (2 < uVar3) break;
      uVar3 = uVar2;
    } while (uVar2 < uVar5);
  }
  this->pageCnt = uVar5 - uVar2;
  if (uVar5 - uVar2 != 0) {
    if ((this->firstHeader).super_IndexPageHeader.next_.ptr == (uint8_t *)0x0) {
      assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0xa0,"firstHeader.next() != nullptr",true);
    }
    plVar1 = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
    while (plVar1 != (long *)0x0) {
      if ((this->pageCnt < 5) && (*plVar1 != 0)) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,0xa3,"pageCnt > localStorageSize || firstHeader.next()->next() == nullptr",true)
        ;
      }
      if (this->pageCnt < *(ulong *)((this->firstHeader).super_IndexPageHeader.next_.ptr + 8)) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,0xa4,"firstHeader.next()->usedCnt <= pageCnt",true);
      }
      puVar4 = (this->firstHeader).super_IndexPageHeader.next_.ptr;
      uVar2 = *(ulong *)(puVar4 + 8);
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          free(*(void **)(puVar4 + uVar5 * 8 + 0x10));
          uVar5 = uVar5 + 1;
          puVar4 = (this->firstHeader).super_IndexPageHeader.next_.ptr;
          uVar2 = *(ulong *)(puVar4 + 8);
        } while (uVar5 < uVar2);
      }
      this->pageCnt = this->pageCnt - uVar2;
      puVar4 = (this->firstHeader).super_IndexPageHeader.next_.ptr;
      (this->firstHeader).super_IndexPageHeader.next_.ptr = *(uint8_t **)puVar4;
      free(puVar4);
      plVar1 = (long *)(this->firstHeader).super_IndexPageHeader.next_.ptr;
    }
  }
  return;
}

Assistant:

void implReleaseAllPages()
		{
			size_t i;
			for ( i=0; i<localStorageSize && i<pageCnt; ++i )
				implReleasePageWrapper( firstHeader.firstPages[i] );
			pageCnt -= i;
			if ( pageCnt )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next() != nullptr );
				while ( firstHeader.next() != nullptr )
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, pageCnt > localStorageSize || firstHeader.next()->next() == nullptr );
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next()->usedCnt <= pageCnt );
					for ( size_t j=0; j<firstHeader.next()->usedCnt; ++j )
						implReleasePageWrapper( firstHeader.next()->pages()[j] );
					pageCnt -= firstHeader.next()->usedCnt;
					PagePointer page = firstHeader.next_;
					firstHeader.next_ = firstHeader.next()->next_;
					implReleasePageWrapper( page );
				}
			}
		}